

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O1

void __thiscall RealTrafficConnection::RealTrafficConnection(RealTrafficConnection *this)

{
  posFlagsTy *ppVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  
  LTOnlineChannel::LTOnlineChannel
            ((LTOnlineChannel *)this,DR_CHANNEL_REAL_TRAFFIC_ONLINE,CHT_TRACKING_DATA,"RealTraffic")
  ;
  (this->super_LTFlightDataChannel).timeLastAcCnt = 0.0;
  (this->super_LTFlightDataChannel).numAcServed = 0;
  (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel =
       (_func_int **)&PTR__RealTrafficConnection_002df4c8;
  *(undefined8 *)((long)&(this->rtMutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->rtMutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->rtMutex).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rtMutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->rtMutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->rtMutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  this->eConnType = RT_CONN_REQU_REPL;
  this->status = RT_STATUS_NONE;
  this->eLicType = RT_LIC_UNKNOWN;
  (this->curr).eRequType = RT_REQU_AUTH;
  (this->curr).sGUID._M_dataplus._M_p = (pointer)&(this->curr).sGUID.field_2;
  (this->curr).sGUID._M_string_length = 0;
  (this->curr).sGUID.field_2._M_local_buf[0] = '\0';
  (this->curr).pos._lat = NAN;
  (this->curr).pos._lon = NAN;
  (this->curr).pos._alt = NAN;
  (this->curr).pos._ts = NAN;
  (this->curr).pos._head = NAN;
  (this->curr).pos._pitch = NAN;
  (this->curr).pos._roll = NAN;
  (this->curr).pos.mergeCount = 1;
  ppVar1 = &(this->curr).pos.f;
  *ppVar1 = (posFlagsTy)((ushort)*ppVar1 & 0x8000);
  (this->curr).pos.edgeIdx = 0xffffffffffffffff;
  (this->curr).tOff = 0;
  (this->tNextTraffic).__d.__r = 0;
  (this->tNextWeather).__d.__r = 0;
  (this->rtWx).QNH = NAN;
  (this->rtWx).next.__d.__r = 0;
  (this->rtWx).pos._lat = NAN;
  (this->rtWx).pos._lon = NAN;
  (this->rtWx).pos._alt = NAN;
  (this->rtWx).pos._ts = NAN;
  (this->rtWx).pos._head = NAN;
  (this->rtWx).pos._pitch = NAN;
  (this->rtWx).pos._roll = NAN;
  (this->rtWx).pos.mergeCount = 1;
  ppVar1 = &(this->rtWx).pos.f;
  *ppVar1 = (posFlagsTy)((ushort)*ppVar1 & 0x8000);
  (this->rtWx).pos.edgeIdx = 0xffffffffffffffff;
  (this->rtWx).nearestMETAR.ICAO._M_dataplus._M_p = (pointer)&(this->rtWx).nearestMETAR.ICAO.field_2
  ;
  *(undefined4 *)&(this->rtWx).nearestMETAR.ICAO.field_2 = 0x4e4b4e55;
  (this->rtWx).nearestMETAR.ICAO._M_string_length = 4;
  (this->rtWx).nearestMETAR.ICAO.field_2._M_local_buf[4] = '\0';
  (this->rtWx).nearestMETAR.dist = NAN;
  (this->rtWx).nearestMETAR.brgTo = NAN;
  (this->rtWx).tOff = 0;
  (this->rtWx).nErr = 0;
  LTWeather::LTWeather(&(this->rtWx).w);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&(this->rtWx).interp._M_elems[0].i + lVar3) = 0;
    *(undefined4 *)((long)&(this->rtWx).interp._M_elems[0].w + lVar3) = 0x3f800000;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0xd0);
  this->lTotalFlights = -1;
  this->bDoParkedTraffic = false;
  (this->thrTcpServer)._M_id._M_thread = 0;
  (this->tcpPosSender).super_SocketNetworking.f_socket = -1;
  (this->tcpPosSender).super_SocketNetworking.f_port = 0;
  (this->tcpPosSender).super_SocketNetworking.f_addr._M_dataplus._M_p =
       (pointer)&(this->tcpPosSender).super_SocketNetworking.f_addr.field_2;
  (this->tcpPosSender).super_SocketNetworking.f_addr._M_string_length = 0;
  (this->tcpPosSender).super_SocketNetworking.f_addr.field_2._M_local_buf[0] = '\0';
  (this->tcpPosSender).super_SocketNetworking.buf = (char *)0x0;
  (this->tcpPosSender).super_SocketNetworking.bufSize = 0x200;
  (this->tcpPosSender).super_SocketNetworking._vptr_SocketNetworking =
       (_func_int **)&PTR__SocketNetworking_002e0658;
  (this->tcpPosSender).f_session_socket = -1;
  (this->tcpPosSender).f_session_addr.sin_family = 0;
  (this->tcpPosSender).f_session_addr.sin_port = 0;
  (this->tcpPosSender).f_session_addr.sin_addr = 0;
  (this->tcpPosSender).f_session_addr.sin_zero[0] = '\0';
  (this->tcpPosSender).f_session_addr.sin_zero[1] = '\0';
  (this->tcpPosSender).f_session_addr.sin_zero[2] = '\0';
  (this->tcpPosSender).f_session_addr.sin_zero[3] = '\0';
  (this->tcpPosSender).f_session_addr.sin_zero[4] = '\0';
  (this->tcpPosSender).f_session_addr.sin_zero[5] = '\0';
  (this->tcpPosSender).f_session_addr.sin_zero[6] = '\0';
  (this->tcpPosSender).f_session_addr.sin_zero[7] = '\0';
  (this->tcpPosSender).selfPipe[0] = -1;
  (this->tcpPosSender).selfPipe[1] = -1;
  this->eTcpThrStatus = THR_NONE;
  (this->udpTrafficData).super_SocketNetworking._vptr_SocketNetworking =
       (_func_int **)&PTR__SocketNetworking_002e0540;
  (this->udpTrafficData).super_SocketNetworking.f_socket = -1;
  (this->udpTrafficData).super_SocketNetworking.f_port = 0;
  (this->udpTrafficData).super_SocketNetworking.f_addr._M_dataplus._M_p =
       (pointer)&(this->udpTrafficData).super_SocketNetworking.f_addr.field_2;
  (this->udpTrafficData).super_SocketNetworking.f_addr._M_string_length = 0;
  (this->udpTrafficData).super_SocketNetworking.f_addr.field_2._M_local_buf[0] = '\0';
  (this->udpTrafficData).super_SocketNetworking.buf = (char *)0x0;
  (this->udpTrafficData).super_SocketNetworking.bufSize = 0x200;
  (this->udpTrafficData).super_SocketNetworking._vptr_SocketNetworking =
       (_func_int **)&PTR__SocketNetworking_002e05e0;
  this->udpPipe[0] = -1;
  this->udpPipe[1] = -1;
  this->lastReceivedTime = 0.0;
  p_Var2 = &(this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->dequeTS).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map
            (&(this->dequeTS).super__Deque_base<double,_std::allocator<double>_>,0);
  this->tsAdjust = 0.0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.urlName
             ,0,(char *)(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                        urlName._M_string_length,0x27bd49);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.urlLink
             ,0,(char *)(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                        urlLink._M_string_length,0x277c8c);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                     urlPopup,0,
             (char *)(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                     urlPopup._M_string_length,0x277cae);
  return;
}

Assistant:

RealTrafficConnection::RealTrafficConnection () :
LTFlightDataChannel(DR_CHANNEL_REAL_TRAFFIC_ONLINE, REALTRAFFIC_NAME)
{
    //purely information
    urlName  = RT_CHECK_NAME;
    urlLink  = RT_CHECK_URL;
    urlPopup = RT_CHECK_POPUP;
}